

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::Impl::lookup(Impl *this,uint64_t parent,StringPtr childName)

{
  StringPtr name;
  bool bVar1;
  Node *this_00;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *other;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  *pOVar2;
  ResolvedDecl *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  char *in_R8;
  Maybe<unsigned_long> MVar3;
  Fault local_150;
  Fault f;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_120;
  undefined1 local_b0 [8];
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  child;
  Node *parentNode;
  uint64_t parent_local;
  Impl *this_local;
  StringPtr childName_local;
  
  this_local = (Impl *)childName.content.size_;
  parentNode = (Node *)childName.content.ptr;
  parent_local = parent;
  childName_local.content.ptr = in_R8;
  childName_local.content.size_ = (size_t)this;
  child.field_1._96_8_ = findNode((Impl *)parent,(uint64_t)parentNode);
  this_00 = kj::_::readMaybe<capnp::compiler::Compiler::Node>
                      ((Maybe<capnp::compiler::Compiler::Node_&> *)((long)&child.field_1 + 0x60));
  if (this_00 != (Node *)0x0) {
    name.content.size_ = (size_t)childName_local.content.ptr;
    name.content.ptr = (char *)this_local;
    Node::resolveMember(&local_120,this_00,name);
    other = kj::_::
            readMaybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>>
                      (&local_120);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)local_b0,other);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_120);
    pOVar2 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_b0);
    if (pOVar2 == (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                   *)0x0) {
      kj::Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
    }
    else {
      pOVar2 = kj::_::
               NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
               ::operator->((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                             *)local_b0);
      bVar1 = kj::
              OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
              ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(pOVar2);
      if (bVar1) {
        pOVar2 = kj::_::
                 NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                 ::operator->((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                               *)local_b0);
        t = kj::
            OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
            ::get<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(pOVar2);
        kj::Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&t->id);
      }
      else {
        kj::Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
      }
    }
    f.exception._0_4_ = 1;
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                      *)local_b0);
    MVar3.ptr.field_1.value = extraout_RDX.value;
    MVar3.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar3.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],unsigned_long&>
            (&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x4e0,FAILED,(char *)0x0,
             "\"lookup()s parameter \'parent\' must be a known ID.\", parent",
             (char (*) [49])"lookup()s parameter \'parent\' must be a known ID.",
             (unsigned_long *)&parentNode);
  kj::_::Debug::Fault::fatal(&local_150);
}

Assistant:

kj::Maybe<uint64_t> Compiler::Impl::lookup(uint64_t parent, kj::StringPtr childName) {
  // Looking up members does not use the workspace, so we don't need to lock it.
  KJ_IF_MAYBE(parentNode, findNode(parent)) {
    KJ_IF_MAYBE(child, parentNode->resolveMember(childName)) {
      if (child->is<NodeTranslator::Resolver::ResolvedDecl>()) {
        return child->get<NodeTranslator::Resolver::ResolvedDecl>().id;
      } else {
        // An alias. We don't support looking up aliases with this method.
        return nullptr;
      }
    } else {
      return nullptr;
    }
  } else {
    KJ_FAIL_REQUIRE("lookup()s parameter 'parent' must be a known ID.", parent);
  }
}